

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::colSingletons(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  long lVar1;
  int iVar2;
  reference pvVar3;
  undefined4 *in_RDI;
  int *sing;
  int *rperm;
  int *rorig;
  int *idx;
  int newrow;
  int p_row;
  int p_col;
  int len;
  int n;
  int k;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000118;
  int in_stack_00000124;
  int in_stack_00000128;
  int in_stack_0000012c;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000130;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 uVar4;
  undefined1 local_a0 [56];
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  reference local_20;
  undefined1 *local_18;
  reference local_10;
  reference local_8;
  
  local_58 = *(long *)(in_RDI + 0x4a);
  local_60 = *(long *)(in_RDI + 0x4c);
  local_68 = *(long *)(in_RDI + 0xb4);
  local_2c = 0;
  do {
    if ((int)in_RDI[0xbe] <= local_2c) {
      return;
    }
    local_44 = *(int *)(local_58 + (long)local_2c * 4);
    local_50 = *(long *)(in_RDI + 0x8a) +
               (long)*(int *)(*(long *)(in_RDI + 0x8c) + (long)local_44 * 4) * 4;
    local_3c = *(int *)(*(long *)(in_RDI + 0x8e) + (long)local_44 * 4);
    for (local_30 = 0; local_30 < local_3c; local_30 = local_30 + 1) {
      local_40 = *(int *)(local_50 + (long)local_30 * 4);
      iVar2 = (*(int *)(*(long *)(in_RDI + 0xa4) + (long)local_40 * 4) +
              *(int *)(*(long *)(in_RDI + 0xa6) + (long)local_40 * 4)) -
              *(int *)(*(long *)(in_RDI + 0xbc) + (long)local_40 * 4);
      local_34 = iVar2;
      while (*(int *)(*(long *)(in_RDI + 0x9c) + (long)local_34 * 4) != local_44) {
        local_34 = local_34 + 1;
      }
      *(undefined4 *)(*(long *)(in_RDI + 0x9c) + (long)local_34 * 4) =
           *(undefined4 *)(*(long *)(in_RDI + 0x9c) + (long)iVar2 * 4);
      *(int *)(*(long *)(in_RDI + 0x9c) + (long)iVar2 * 4) = local_44;
      iVar2 = *(int *)(*(long *)(in_RDI + 0xbc) + (long)local_40 * 4) + -1;
      *(int *)(*(long *)(in_RDI + 0xbc) + (long)local_40 * 4) = iVar2;
      if (iVar2 == 1) {
        lVar1 = *(long *)(in_RDI + 0x9c);
        iVar2 = *(int *)(*(long *)(in_RDI + 0xa6) + (long)local_40 * 4) + -1;
        *(int *)(*(long *)(in_RDI + 0xa6) + (long)local_40 * 4) = iVar2;
        local_48 = *(int *)(lVar1 + (long)(iVar2 + *(int *)(*(long *)(in_RDI + 0xa4) +
                                                           (long)local_40 * 4)) * 4);
        if (-1 < *(int *)(local_60 + (long)local_48 * 4)) {
          *in_RDI = 2;
          return;
        }
        local_38 = *(int *)(*(long *)(in_RDI + 0x8c) + (long)local_48 * 4);
        iVar2 = *(int *)(*(long *)(in_RDI + 0x8e) + (long)local_48 * 4) + -1;
        *(int *)(*(long *)(in_RDI + 0x8e) + (long)local_48 * 4) = iVar2;
        local_38 = local_38 + iVar2;
        local_34 = local_38;
        while (*(int *)(*(long *)(in_RDI + 0x8a) + (long)local_34 * 4) != local_40) {
          local_34 = local_34 + -1;
        }
        uVar4 = in_RDI[0xbe];
        local_20 = std::
                   vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *)(in_RDI + 0x84),(long)local_34);
        local_18 = local_a0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)CONCAT44(uVar4,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff38);
        setPivot(in_stack_00000130,in_stack_0000012c,in_stack_00000128,in_stack_00000124,
                 in_stack_00000118);
        iVar2 = in_RDI[0xbe];
        in_RDI[0xbe] = iVar2 + 1;
        *(int *)(local_68 + (long)iVar2 * 4) = local_40;
        pvVar3 = std::
                 vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               *)(in_RDI + 0x84),(long)local_38);
        local_8 = std::
                  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                *)(in_RDI + 0x84),(long)local_34);
        local_10 = pvVar3;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)CONCAT44(uVar4,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff38);
        *(undefined4 *)(*(long *)(in_RDI + 0x8a) + (long)local_34 * 4) =
             *(undefined4 *)(*(long *)(in_RDI + 0x8a) + (long)local_38 * 4);
      }
      else if (iVar2 == 0) {
        *in_RDI = 2;
        return;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

void CLUFactor<R>::colSingletons()
{
   int i, j, k, n;
   int len;
   int p_col, p_row, newrow;
   int* idx;
   int* rorig = row.orig;
   int* rperm = row.perm;
   int* sing = temp.s_mark;


   /*  Iteratively update column counts due to removed column singletons
    *  thereby removing new arising columns singletons
    *  and computing the index of the first row singleton (-1)
    *  until no more can be found.
    */

   for(i = 0; i < temp.stage; ++i)
   {
      p_row = rorig[i];
      assert(p_row >= 0);
      idx = &(u.row.idx[u.row.start[p_row]]);
      len = u.row.len[p_row];

      for(j = 0; j < len; ++j)
      {
         /*  Move pivotal nonzeros to front of column.
          */
         p_col = idx[j];
         assert(temp.s_cact[p_col] > 0);

         n = u.col.start[p_col] + u.col.len[p_col] - temp.s_cact[p_col];

         for(k = n; u.col.idx[k] != p_row; ++k)
            ;

         assert(k < u.col.start[p_col] + u.col.len[p_col]);

         u.col.idx[k] = u.col.idx[n];

         u.col.idx[n] = p_row;

         n = --(temp.s_cact[p_col]);          /* column nonzeros of ACTIVE matrix */

         if(n == 1)                   /* Here is another singleton */
         {
            newrow = u.col.idx[--u.col.len[p_col] + u.col.start[p_col]];

            /*      Ensure, matrix not singular
             */

            if(rperm[newrow] >= 0)
            {
               this->stat = SLinSolver<R>::SINGULAR;
               return;
            }

            /*      Find singleton in row.
             */
            n = u.row.start[newrow] + (--(u.row.len[newrow]));

            for(k = n; u.row.idx[k] != p_col; --k)
               ;

            /*      Remove singleton from column.
             */
            setPivot(temp.stage, p_col, newrow, u.row.val[k]);

            sing[temp.stage++] = p_col;

            /*      Move pivot element to diag.
             */
            u.row.val[k] = u.row.val[n];

            u.row.idx[k] = u.row.idx[n];
         }
         else if(n == 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }
      }
   }

   assert(temp.stage <= thedim);
}